

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void icu_63::initLeapMonthPattern
               (UnicodeString *field,int32_t index,CalendarDataSink *sink,CharString *path,
               UErrorCode *status)

{
  UBool UVar1;
  char *src;
  Hashtable *this;
  UnicodeString *src_00;
  undefined4 in_register_00000034;
  UnicodeString *leapMonthPattern;
  undefined1 local_c8 [8];
  UnicodeString leapLabel;
  Hashtable *leapMonthTable;
  UnicodeString pathUString;
  UErrorCode *status_local;
  CharString *path_local;
  CalendarDataSink *sink_local;
  int32_t index_local;
  UnicodeString *field_local;
  
  pathUString.fUnion._48_8_ = status;
  UnicodeString::remove(field + index,(char *)CONCAT44(in_register_00000034,index));
  UVar1 = ::U_SUCCESS(*(UErrorCode *)pathUString.fUnion._48_8_);
  if (UVar1 != '\0') {
    src = CharString::data(path);
    UnicodeString::UnicodeString((UnicodeString *)&leapMonthTable,src,-1,kInvariant);
    this = (Hashtable *)Hashtable::get(&sink->maps,(UnicodeString *)&leapMonthTable);
    if (this == (Hashtable *)0x0) {
      *(undefined4 *)pathUString.fUnion._48_8_ = 2;
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr
                ((ConstChar16Ptr *)&leapMonthPattern,
                 L"leap慤⵹潦浲瑡攭捸灥⵴慮牲睯搀祡渭牡潲w慤⵹瑳湡慤潬敮攭捸灥⵴慮牲睯攀慲愭扢r牥ⵡ慮敭攀慲渭牡潲w敭慴潺敮氭湯g敭慴潺敮猭潨瑲洀湯桴昭牯慭⵴硥散瑰渭牡潲w潭瑮⵨慮牲睯洀湯桴猭慴摮污湯ⵥ硥散瑰渭牡潲w㙎捩彵㌶㐱潌慣敬慃档䭥祥义当㌲桓牡摥慄整潆浲瑡祓扭汯䕳䕅一椶畣㙟㠳慃档䭥祥义当㌲桓牡摥慄整潆浲瑡祓扭汯䕳䕅琀浩䑥瑡a污潬敷d牅a畑牡整r慄⵹晏圭敥k慄y潈牵䴀湩瑵e敓潣摮吀浩穥湯e牥a畱牡整r潭瑮h敷步眀敥佫䵦湯桴眀敥摫祡搀祡晏教牡眀敥摫祡晏潍瑮h慤灹牥潩d湤"
                );
      UnicodeString::UnicodeString
                ((UnicodeString *)local_c8,'\0',(ConstChar16Ptr *)&leapMonthPattern,4);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&leapMonthPattern);
      src_00 = (UnicodeString *)Hashtable::get(this,(UnicodeString *)local_c8);
      if (src_00 == (UnicodeString *)0x0) {
        UnicodeString::setToBogus(field + index);
      }
      else {
        UnicodeString::fastCopyFrom(field + index,src_00);
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_c8);
    }
    UnicodeString::~UnicodeString((UnicodeString *)&leapMonthTable);
  }
  return;
}

Assistant:

static void
initLeapMonthPattern(UnicodeString *field, int32_t index, CalendarDataSink &sink, CharString &path, UErrorCode &status) {
    field[index].remove();
    if (U_SUCCESS(status)) {
        UnicodeString pathUString(path.data(), -1, US_INV);
        Hashtable *leapMonthTable = static_cast<Hashtable*>(sink.maps.get(pathUString));
        if (leapMonthTable != NULL) {
            UnicodeString leapLabel(FALSE, kLeapTagUChar, UPRV_LENGTHOF(kLeapTagUChar));
            UnicodeString *leapMonthPattern = static_cast<UnicodeString*>(leapMonthTable->get(leapLabel));
            if (leapMonthPattern != NULL) {
                field[index].fastCopyFrom(*leapMonthPattern);
            } else {
                field[index].setToBogus();
            }
            return;
        }
        status = U_MISSING_RESOURCE_ERROR;
    }
}